

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

size_t getendpos(lua_State *L,int arg,lua_Integer def,size_t len)

{
  lua_State *plVar1;
  lua_Integer pos;
  size_t len_local;
  lua_Integer def_local;
  int arg_local;
  lua_State *L_local;
  
  plVar1 = (lua_State *)luaL_optinteger(L,arg,def);
  L_local = (lua_State *)len;
  if (((long)plVar1 <= (long)len) && (L_local = plVar1, (long)plVar1 < 0)) {
    if ((long)plVar1 < (long)-len) {
      L_local = (lua_State *)0x0;
    }
    else {
      L_local = (lua_State *)((long)&plVar1->next + len + 1);
    }
  }
  return (size_t)L_local;
}

Assistant:

static size_t getendpos (lua_State *L, int arg, lua_Integer def,
                         size_t len) {
  lua_Integer pos = luaL_optinteger(L, arg, def);
  if (pos > (lua_Integer)len)
    return len;
  else if (pos >= 0)
    return (size_t)pos;
  else if (pos < -(lua_Integer)len)
    return 0;
  else return len + (size_t)pos + 1;
}